

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplexTimer.h
# Opt level: O2

bool __thiscall
SimplexTimer::reportSimplexInnerClock
          (SimplexTimer *this,HighsTimerClock *simplex_timer_clock,double tolerance_percent_report_)

{
  bool bVar1;
  initializer_list<int> __l;
  allocator_type local_121;
  double local_120;
  _Vector_base<int,_std::allocator<int>_> local_118;
  vector<int,_std::allocator<int>_> simplex_clock_list;
  int local_e8 [50];
  
  local_120 = tolerance_percent_report_;
  memcpy(local_e8,&DAT_003af4b0,200);
  __l._M_len = 0x32;
  __l._M_array = local_e8;
  std::vector<int,_std::allocator<int>_>::vector(&simplex_clock_list,__l,&local_121);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_118,&simplex_clock_list);
  bVar1 = reportSimplexClockList
                    (this,"SimplexInner",(vector<int,_std::allocator<int>_> *)&local_118,
                     simplex_timer_clock,local_120);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_118);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&simplex_clock_list.super__Vector_base<int,_std::allocator<int>_>);
  return bVar1;
}

Assistant:

bool reportSimplexInnerClock(const HighsTimerClock& simplex_timer_clock,
                               const double tolerance_percent_report_ = -1) {
    const std::vector<HighsInt> simplex_clock_list{
        initialiseSimplexLpBasisAndFactorClock,
        allocateSimplexArraysClock,
        initialiseSimplexCostBoundsClock,
        setNonbasicMoveClock,
        DevexIzClock,
        DseIzClock,
        ComputeDualClock,
        CorrectDualClock,
        ComputePrimalClock,
        CollectPrIfsClock,
        ComputePrIfsClock,
        ComputeDuIfsClock,
        ComputeDuObjClock,
        ComputePrObjClock,
        InvertClock,
        ReportRebuildClock,
        PermWtClock,
        ChuzcPrimalClock,
        ChuzcHyperInitialiselClock,
        ChuzcHyperBasicFeasibilityChangeClock,
        ChuzcHyperDualClock,
        ChuzcHyperClock,
        Chuzc0Clock,
        Chuzc1Clock,
        Chuzc2Clock,
        Chuzc3Clock,
        Chuzc4Clock,
        Chuzc5Clock,
        FtranClock,
        ChuzrDualClock,
        Chuzr1Clock,
        Chuzr2Clock,
        BtranClock,
        PriceClock,
        BtranBasicFeasibilityChangeClock,
        PriceBasicFeasibilityChangeClock,
        UpdateDualBasicFeasibilityChangeClock,
        FtranBfrtClock,
        FtranDseClock,
        BtranPseClock,
        BtranFullClock,
        PriceFullClock,
        DevexWtClock,
        DevexUpdateWeightClock,
        DseUpdateWeightClock,
        UpdatePrimalClock,
        UpdateDualClock,
        UpdatePivotsClock,
        UpdateFactorClock,
        UpdateMatrixClock};
    return reportSimplexClockList("SimplexInner", simplex_clock_list,
                                  simplex_timer_clock,
                                  tolerance_percent_report_);
  }